

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O1

char * asterism_strstr(asterism_str haystack,asterism_str needle)

{
  int iVar1;
  ulong __n;
  ulong uVar2;
  
  __n = needle.len;
  if (__n <= haystack.len) {
    uVar2 = 0;
    do {
      iVar1 = bcmp(haystack.p + uVar2,needle.p,__n);
      if (iVar1 == 0) {
        return haystack.p + uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 <= haystack.len - __n);
  }
  return (char *)0x0;
}

Assistant:

const char *asterism_strstr(const struct asterism_str haystack,
                            const struct asterism_str needle)
{
    size_t i;
    if (needle.len > haystack.len)
        return NULL;
    for (i = 0; i <= haystack.len - needle.len; i++)
    {
        if (memcmp(haystack.p + i, needle.p, needle.len) == 0)
        {
            return haystack.p + i;
        }
    }
    return NULL;
}